

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx::OrientedDiscMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  __int_type_conflict _Var11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined4 uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  Primitive *local_348;
  undefined1 local_340 [32];
  RTCFilterFunctionNArguments local_310;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar8 = context->scene;
  uVar23 = Disc->sharedGeomID;
  uVar24 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[uVar23].ptr;
  lVar10 = *(long *)&pGVar9->field_0x58;
  _Var11 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar31 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar34._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar27);
  auVar34._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar24);
  uVar29 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar36._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar29);
  auVar36._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar31);
  uVar25 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar33 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar26 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar26);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar25);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar40._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar32);
  auVar40._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar33);
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var12 = pGVar9[1].intersectionFilterN;
  lVar30 = uVar29 * (long)p_Var12;
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar27 * (long)p_Var12);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar24 * (long)p_Var12);
  auVar52._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar30);
  auVar52._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar31 * (long)p_Var12);
  auVar54._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar26 * (long)p_Var12);
  auVar54._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar25 * (long)p_Var12);
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar10 + (long)p_Var12 * uVar32);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar33 * (long)p_Var12);
  auVar42 = vunpcklps_avx(auVar34,auVar38);
  local_2c0 = vunpckhps_avx(auVar34,auVar38);
  auVar34 = vunpcklps_avx(auVar36,auVar40);
  auVar22 = vunpckhps_avx(auVar36,auVar40);
  auVar39 = vunpcklps_avx(auVar42,auVar34);
  auVar45 = vunpckhps_avx(auVar42,auVar34);
  local_340 = vunpcklps_avx(local_2c0,auVar22);
  auVar36 = vunpcklps_avx(auVar49,auVar54);
  auVar42 = vunpckhps_avx(auVar49,auVar54);
  auVar38 = vunpcklps_avx(auVar52,auVar55);
  auVar34 = vunpckhps_avx(auVar52,auVar55);
  auVar49 = vunpcklps_avx(auVar42,auVar34);
  local_260 = vunpcklps_avx(auVar36,auVar38);
  local_1c0 = vunpckhps_avx(auVar36,auVar38);
  local_290 = vshufps_avx(ZEXT416(uVar23),ZEXT416(uVar23),0);
  local_2a0 = local_290;
  fVar1 = *(float *)(ray + k * 4 + 0x20);
  auVar50._4_4_ = fVar1;
  auVar50._0_4_ = fVar1;
  auVar50._8_4_ = fVar1;
  auVar50._12_4_ = fVar1;
  auVar50._16_4_ = fVar1;
  auVar50._20_4_ = fVar1;
  auVar50._24_4_ = fVar1;
  auVar50._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x80);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar41._0_4_ = fVar2 * local_260._0_4_ + fVar3 * local_1c0._0_4_ + fVar4 * auVar49._0_4_;
  auVar41._4_4_ = fVar2 * local_260._4_4_ + fVar3 * local_1c0._4_4_ + fVar4 * auVar49._4_4_;
  auVar41._8_4_ = fVar2 * local_260._8_4_ + fVar3 * local_1c0._8_4_ + fVar4 * auVar49._8_4_;
  auVar41._12_4_ = fVar2 * local_260._12_4_ + fVar3 * local_1c0._12_4_ + fVar4 * auVar49._12_4_;
  auVar41._16_4_ = fVar2 * local_260._16_4_ + fVar3 * local_1c0._16_4_ + fVar4 * auVar49._16_4_;
  auVar41._20_4_ = fVar2 * local_260._20_4_ + fVar3 * local_1c0._20_4_ + fVar4 * auVar49._20_4_;
  auVar41._24_4_ = fVar2 * local_260._24_4_ + fVar3 * local_1c0._24_4_ + fVar4 * auVar49._24_4_;
  auVar41._28_4_ = 0;
  auVar34 = vcmpps_avx(ZEXT432(0) << 0x20,auVar41,0);
  auVar21 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar56._16_16_ = auVar21;
  auVar56._0_16_ = auVar21;
  auVar42 = vcvtdq2ps_avx(auVar56);
  auVar36 = vcmpps_avx(_DAT_01faff40,auVar42,1);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = 0x3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar57._16_4_ = 0x3f800000;
  auVar57._20_4_ = 0x3f800000;
  auVar57._24_4_ = 0x3f800000;
  auVar57._28_4_ = 0x3f800000;
  auVar42 = vblendvps_avx(auVar41,auVar57,auVar34);
  fVar5 = *(float *)(ray + k * 4 + 0x40);
  auVar58._4_4_ = fVar5;
  auVar58._0_4_ = fVar5;
  auVar58._8_4_ = fVar5;
  auVar58._12_4_ = fVar5;
  auVar58._16_4_ = fVar5;
  auVar58._20_4_ = fVar5;
  auVar58._24_4_ = fVar5;
  auVar58._28_4_ = fVar5;
  auVar34 = vandnps_avx(auVar34,auVar36);
  auVar36 = vsubps_avx(local_340,auVar58);
  auVar38 = vsubps_avx(auVar45,auVar50);
  fVar6 = *(float *)(ray + k * 4);
  auVar59._4_4_ = fVar6;
  auVar59._0_4_ = fVar6;
  auVar59._8_4_ = fVar6;
  auVar59._12_4_ = fVar6;
  auVar59._16_4_ = fVar6;
  auVar59._20_4_ = fVar6;
  auVar59._24_4_ = fVar6;
  auVar59._28_4_ = fVar6;
  auVar40 = vsubps_avx(auVar39,auVar59);
  auVar41 = local_260;
  auVar43._0_4_ =
       auVar38._0_4_ * local_1c0._0_4_ + auVar36._0_4_ * auVar49._0_4_ +
       local_260._0_4_ * auVar40._0_4_;
  auVar43._4_4_ =
       auVar38._4_4_ * local_1c0._4_4_ + auVar36._4_4_ * auVar49._4_4_ +
       local_260._4_4_ * auVar40._4_4_;
  auVar43._8_4_ =
       auVar38._8_4_ * local_1c0._8_4_ + auVar36._8_4_ * auVar49._8_4_ +
       local_260._8_4_ * auVar40._8_4_;
  auVar43._12_4_ =
       auVar38._12_4_ * local_1c0._12_4_ + auVar36._12_4_ * auVar49._12_4_ +
       local_260._12_4_ * auVar40._12_4_;
  auVar43._16_4_ =
       auVar38._16_4_ * local_1c0._16_4_ + auVar36._16_4_ * auVar49._16_4_ +
       local_260._16_4_ * auVar40._16_4_;
  auVar43._20_4_ =
       auVar38._20_4_ * local_1c0._20_4_ + auVar36._20_4_ * auVar49._20_4_ +
       local_260._20_4_ * auVar40._20_4_;
  auVar43._24_4_ =
       auVar38._24_4_ * local_1c0._24_4_ + auVar36._24_4_ * auVar49._24_4_ +
       local_260._24_4_ * auVar40._24_4_;
  auVar43._28_4_ = auVar38._28_4_ + auVar36._28_4_ + auVar40._28_4_;
  local_200 = vdivps_avx(auVar43,auVar42);
  uVar28 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar42._4_4_ = uVar28;
  auVar42._0_4_ = uVar28;
  auVar42._8_4_ = uVar28;
  auVar42._12_4_ = uVar28;
  auVar42._16_4_ = uVar28;
  auVar42._20_4_ = uVar28;
  auVar42._24_4_ = uVar28;
  auVar42._28_4_ = uVar28;
  uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_280._4_4_ = uVar28;
  local_280._0_4_ = uVar28;
  local_280._8_4_ = uVar28;
  local_280._12_4_ = uVar28;
  local_280._16_4_ = uVar28;
  local_280._20_4_ = uVar28;
  local_280._24_4_ = uVar28;
  local_280._28_4_ = uVar28;
  auVar42 = vcmpps_avx(auVar42,local_200,2);
  auVar36 = vcmpps_avx(local_200,local_280,2);
  auVar42 = vandps_avx(auVar42,auVar36);
  auVar38 = auVar34 & auVar42;
  if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar38 >> 0x7f,0) != '\0') ||
        (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar38 >> 0xbf,0) != '\0') ||
      (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar38[0x1f] < '\0') {
    auVar42 = vandps_avx(auVar34,auVar42);
    auVar40 = vunpckhps_avx(local_2c0,auVar22);
    fVar13 = local_200._0_4_;
    fVar14 = local_200._4_4_;
    fVar15 = local_200._8_4_;
    fVar16 = local_200._12_4_;
    fVar17 = local_200._16_4_;
    fVar18 = local_200._20_4_;
    fVar19 = local_200._24_4_;
    auVar44._0_4_ = fVar6 + fVar2 * fVar13;
    auVar44._4_4_ = fVar6 + fVar2 * fVar14;
    auVar44._8_4_ = fVar6 + fVar2 * fVar15;
    auVar44._12_4_ = fVar6 + fVar2 * fVar16;
    auVar44._16_4_ = fVar6 + fVar2 * fVar17;
    auVar44._20_4_ = fVar6 + fVar2 * fVar18;
    auVar44._24_4_ = fVar6 + fVar2 * fVar19;
    auVar44._28_4_ = fVar6 + auVar36._28_4_;
    auVar46._0_4_ = fVar1 + fVar3 * fVar13;
    auVar46._4_4_ = fVar1 + fVar3 * fVar14;
    auVar46._8_4_ = fVar1 + fVar3 * fVar15;
    auVar46._12_4_ = fVar1 + fVar3 * fVar16;
    auVar46._16_4_ = fVar1 + fVar3 * fVar17;
    auVar46._20_4_ = fVar1 + fVar3 * fVar18;
    auVar46._24_4_ = fVar1 + fVar3 * fVar19;
    auVar46._28_4_ = fVar1 + local_260._28_4_;
    auVar47._0_4_ = fVar5 + fVar4 * fVar13;
    auVar47._4_4_ = fVar5 + fVar4 * fVar14;
    auVar47._8_4_ = fVar5 + fVar4 * fVar15;
    auVar47._12_4_ = fVar5 + fVar4 * fVar16;
    auVar47._16_4_ = fVar5 + fVar4 * fVar17;
    auVar47._20_4_ = fVar5 + fVar4 * fVar18;
    auVar47._24_4_ = fVar5 + fVar4 * fVar19;
    auVar47._28_4_ = fVar5 + auVar22._28_4_;
    auVar34 = vsubps_avx(auVar44,auVar39);
    auVar36 = vsubps_avx(auVar46,auVar45);
    auVar38 = vsubps_avx(auVar47,local_340);
    auVar45._0_4_ =
         auVar34._0_4_ * auVar34._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar38._0_4_ * auVar38._0_4_;
    auVar45._4_4_ =
         auVar34._4_4_ * auVar34._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar38._4_4_ * auVar38._4_4_;
    auVar45._8_4_ =
         auVar34._8_4_ * auVar34._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar38._8_4_ * auVar38._8_4_;
    auVar45._12_4_ =
         auVar34._12_4_ * auVar34._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar38._12_4_ * auVar38._12_4_;
    auVar45._16_4_ =
         auVar34._16_4_ * auVar34._16_4_ +
         auVar36._16_4_ * auVar36._16_4_ + auVar38._16_4_ * auVar38._16_4_;
    auVar45._20_4_ =
         auVar34._20_4_ * auVar34._20_4_ +
         auVar36._20_4_ * auVar36._20_4_ + auVar38._20_4_ * auVar38._20_4_;
    auVar45._24_4_ =
         auVar34._24_4_ * auVar34._24_4_ +
         auVar36._24_4_ * auVar36._24_4_ + auVar38._24_4_ * auVar38._24_4_;
    auVar45._28_4_ = auVar34._28_4_ + auVar36._28_4_ + auVar38._28_4_;
    auVar22._4_4_ = auVar40._4_4_ * auVar40._4_4_;
    auVar22._0_4_ = auVar40._0_4_ * auVar40._0_4_;
    auVar22._8_4_ = auVar40._8_4_ * auVar40._8_4_;
    auVar22._12_4_ = auVar40._12_4_ * auVar40._12_4_;
    auVar22._16_4_ = auVar40._16_4_ * auVar40._16_4_;
    auVar22._20_4_ = auVar40._20_4_ * auVar40._20_4_;
    auVar22._24_4_ = auVar40._24_4_ * auVar40._24_4_;
    auVar22._28_4_ = auVar40._28_4_;
    auVar34 = vcmpps_avx(auVar45,auVar22,1);
    auVar36 = auVar42 & auVar34;
    if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar36 >> 0x7f,0) != '\0') ||
          (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar36 >> 0xbf,0) != '\0') ||
        (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar36[0x1f] < '\0')
    {
      auVar42 = vandps_avx(auVar42,auVar34);
      auVar48 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_220 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_240 = local_220;
      local_1e0 = local_260._0_8_;
      uStack_1d8 = local_260._8_8_;
      uStack_1d0 = local_260._16_8_;
      uStack_1c8 = local_260._24_8_;
      local_2e0._0_8_ = auVar49._0_8_;
      local_2e0._8_8_ = auVar49._8_8_;
      local_2e0._16_8_ = auVar49._16_8_;
      local_2e0._24_8_ = auVar49._24_8_;
      local_1a0 = local_2e0._0_8_;
      uStack_198 = local_2e0._8_8_;
      uStack_190 = local_2e0._16_8_;
      uStack_188 = local_2e0._24_8_;
      uVar28 = vmovmskps_avx(auVar42);
      uVar31 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar28);
      uVar23 = 1 << ((byte)k & 0x1f);
      auVar51 = ZEXT464(0) << 0x20;
      auVar53 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      local_348 = Disc;
      local_260 = auVar41;
      do {
        local_310.hit = (RTCHitN *)&local_180;
        local_310.valid = (int *)local_380;
        uVar24 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar7 = *(uint *)(local_2a0 + uVar24 * 4);
        pGVar9 = (pSVar8->geometries).items[uVar7].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar31 = uVar31 ^ 1L << (uVar24 & 0x3f);
        }
        else {
          local_340._0_8_ = uVar24;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_120 = *(undefined4 *)(local_240 + uVar24 * 4);
          local_100 = *(undefined4 *)(local_220 + uVar24 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar24 * 4);
          local_310.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar7),0);
          local_e0 = (local_348->primIDs).field_0.i[uVar24];
          local_180 = *(undefined4 *)((long)&local_1e0 + uVar24 * 4);
          uVar28 = *(undefined4 *)(local_1c0 + uVar24 * 4);
          local_160._4_4_ = uVar28;
          local_160._0_4_ = uVar28;
          local_160._8_4_ = uVar28;
          local_160._12_4_ = uVar28;
          local_160._16_4_ = uVar28;
          local_160._20_4_ = uVar28;
          local_160._24_4_ = uVar28;
          local_160._28_4_ = uVar28;
          uVar28 = *(undefined4 *)((long)&local_1a0 + uVar24 * 4);
          local_140._4_4_ = uVar28;
          local_140._0_4_ = uVar28;
          local_140._8_4_ = uVar28;
          local_140._12_4_ = uVar28;
          local_140._16_4_ = uVar28;
          local_140._20_4_ = uVar28;
          local_140._24_4_ = uVar28;
          local_140._28_4_ = uVar28;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          local_2e0 = vcmpps_avx(auVar48._0_32_,auVar48._0_32_,0xf);
          uStack_9c = (local_310.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_310.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_380 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar23 & 0xf) << 4));
          local_370 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar23 >> 4) * 0x10);
          local_310.geometryUserPtr = pGVar9->userPtr;
          local_310.N = 8;
          local_310.ray = (RTCRayN *)ray;
          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_2c0._0_8_ = uVar31;
            (*pGVar9->occlusionFilterN)(&local_310);
            auVar53 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
            uVar31 = local_2c0._0_8_;
          }
          auVar21 = vpcmpeqd_avx(auVar51._0_16_,local_380);
          auVar20 = vpcmpeqd_avx(auVar51._0_16_,local_370);
          auVar39._16_16_ = auVar20;
          auVar39._0_16_ = auVar21;
          auVar42 = local_2e0 & ~auVar39;
          if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar42 >> 0x7f,0) == '\0') &&
                (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar42 >> 0xbf,0) == '\0') &&
              (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar42[0x1f]) {
            auVar35._0_4_ = auVar21._0_4_ ^ local_2e0._0_4_;
            auVar35._4_4_ = auVar21._4_4_ ^ local_2e0._4_4_;
            auVar35._8_4_ = auVar21._8_4_ ^ local_2e0._8_4_;
            auVar35._12_4_ = auVar21._12_4_ ^ local_2e0._12_4_;
            auVar35._16_4_ = auVar20._0_4_ ^ local_2e0._16_4_;
            auVar35._20_4_ = auVar20._4_4_ ^ local_2e0._20_4_;
            auVar35._24_4_ = auVar20._8_4_ ^ local_2e0._24_4_;
            auVar35._28_4_ = auVar20._12_4_ ^ local_2e0._28_4_;
          }
          else {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              local_2c0._0_8_ = uVar31;
              (*p_Var12)(&local_310);
              auVar53 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
              uVar31 = local_2c0._0_8_;
            }
            auVar21 = vpcmpeqd_avx(auVar51._0_16_,local_380);
            auVar20 = vpcmpeqd_avx(auVar51._0_16_,local_370);
            auVar37._16_16_ = auVar20;
            auVar37._0_16_ = auVar21;
            auVar35._0_4_ = auVar21._0_4_ ^ local_2e0._0_4_;
            auVar35._4_4_ = auVar21._4_4_ ^ local_2e0._4_4_;
            auVar35._8_4_ = auVar21._8_4_ ^ local_2e0._8_4_;
            auVar35._12_4_ = auVar21._12_4_ ^ local_2e0._12_4_;
            auVar35._16_4_ = auVar20._0_4_ ^ local_2e0._16_4_;
            auVar35._20_4_ = auVar20._4_4_ ^ local_2e0._20_4_;
            auVar35._24_4_ = auVar20._8_4_ ^ local_2e0._24_4_;
            auVar35._28_4_ = auVar20._12_4_ ^ local_2e0._28_4_;
            auVar42 = vblendvps_avx(auVar53._0_32_,*(undefined1 (*) [32])(local_310.ray + 0x100),
                                    auVar37);
            *(undefined1 (*) [32])(local_310.ray + 0x100) = auVar42;
          }
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0x7f,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar35 >> 0xbf,0) != '\0') ||
              (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar35[0x1f] < '\0') {
            return true;
          }
          *(undefined4 *)(ray + k * 4 + 0x100) = local_280._0_4_;
          uVar31 = uVar31 ^ 1L << (local_340._0_8_ & 0x3f);
        }
      } while (uVar31 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }